

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O2

GCproto * lj_bcread_proto(LexState *ls)

{
  char **pp;
  uint64_t uVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  byte bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  GCproto *pGVar17;
  GCstr *pGVar18;
  void *pvVar19;
  GCtab *t;
  TValue *pTVar20;
  ulong uVar21;
  char *pcVar22;
  byte bVar24;
  size_t __n;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint32_t hbits;
  char *pcVar28;
  short sVar29;
  uint uVar30;
  byte *pbVar31;
  uint uVar32;
  uint uVar33;
  undefined8 *puVar34;
  double *pdVar35;
  bool bVar36;
  TValue local_38;
  char *pcVar23;
  
  pp = &ls->p;
  pbVar31 = (byte *)ls->p;
  ls->p = (char *)(pbVar31 + 1);
  bVar7 = *pbVar31;
  ls->p = (char *)(pbVar31 + 2);
  bVar24 = pbVar31[1];
  ls->p = (char *)(pbVar31 + 3);
  bVar3 = pbVar31[2];
  ls->p = (char *)(pbVar31 + 4);
  bVar4 = pbVar31[3];
  uVar8 = lj_buf_ruleb128(pp);
  uVar9 = lj_buf_ruleb128(pp);
  uVar10 = lj_buf_ruleb128(pp);
  uVar27 = uVar10 + 1;
  uVar12 = 0;
  if ((ls->level & 2) == 0) {
    uVar11 = lj_buf_ruleb128(pp);
    uVar13 = 0;
    __n = 0;
    uVar12 = 0;
    if (uVar11 != 0) {
      uVar12 = lj_buf_ruleb128(pp);
      uVar13 = lj_buf_ruleb128(pp);
      __n = (size_t)uVar11;
    }
  }
  else {
    uVar13 = 0;
    __n = 0;
  }
  uVar30 = uVar27 * 4 + uVar8 * 8 + 0x6f & 0xfffffff8;
  uVar32 = uVar30 + uVar9 * 8;
  uVar14 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + uVar32;
  uVar33 = (int)__n + uVar14;
  pGVar17 = (GCproto *)lj_mem_newgco(ls->L,(ulong)uVar33);
  pGVar17->gct = '\a';
  pGVar17->numparams = bVar24;
  pGVar17->framesize = bVar3;
  pGVar17->sizebc = uVar27;
  uVar1 = (long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar30;
  (pGVar17->k).ptr64 = uVar1;
  pvVar19 = (void *)((long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar32);
  (pGVar17->uv).ptr64 = (uint64_t)pvVar19;
  pGVar17->sizekgc = 0;
  pGVar17->sizekn = uVar9;
  pGVar17->sizept = uVar33;
  pGVar17->sizeuv = bVar4;
  pGVar17->flags = bVar7;
  pGVar17->trace = 0;
  (pGVar17->chunkname).gcptr64 = (uint64_t)ls->chunkname;
  *(undefined4 *)(uVar1 + (ulong)(uVar8 + 1) * -8) = 0;
  bVar7 = (bVar7 & 2) >> 1;
  *(uint *)&pGVar17[1].nextgc.gcptr64 = (uint)bVar7 + (uint)bVar7 * 2 + (uint)bVar3 * 0x100 + 0x59;
  uVar21 = (ulong)(uVar27 * 4 - 4);
  pcVar28 = ls->p;
  ls->p = pcVar28 + uVar21;
  memcpy((void *)((long)&pGVar17[1].nextgc.gcptr64 + 4),pcVar28,uVar21);
  if ((ls->level & 1) != 0) {
    for (lVar26 = 0x1b; lVar26 - 0x1aU < (ulong)uVar27; lVar26 = lVar26 + 1) {
      uVar30 = *(uint *)((long)&(pGVar17->nextgc).gcptr64 + lVar26 * 4);
      *(uint *)((long)&(pGVar17->nextgc).gcptr64 + lVar26 * 4) =
           uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 | uVar30 << 0x18;
    }
  }
  if (bVar4 != 0) {
    pcVar28 = ls->p;
    ls->p = pcVar28 + (uint)bVar4 * 2;
    memcpy(pvVar19,pcVar28,(ulong)((uint)bVar4 * 2));
    if ((ls->level & 1) != 0) {
      for (uVar21 = 0; bVar4 != uVar21; uVar21 = uVar21 + 1) {
        puVar2 = (ushort *)((long)pvVar19 + uVar21 * 2);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
      }
    }
  }
  puVar34 = (undefined8 *)((pGVar17->k).ptr64 + (ulong)uVar8 * -8);
  uVar11 = 0;
  do {
    if (uVar11 == uVar8) {
      pGVar17->sizekgc = uVar8;
      pdVar35 = (double *)(pGVar17->k).ptr64;
      for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
        bVar7 = **pp;
        pbVar31 = (byte *)(*pp + 1);
        uVar27 = (uint)(bVar7 >> 1);
        if ((char)bVar7 < '\0') {
          uVar27 = uVar27 & 0x3f;
          bVar24 = 6;
          do {
            bVar3 = *pbVar31;
            uVar27 = uVar27 | (bVar3 & 0x7f) << (bVar24 & 0x1f);
            pbVar31 = pbVar31 + 1;
            bVar24 = bVar24 + 7;
          } while ((char)bVar3 < '\0');
        }
        *pp = (char *)pbVar31;
        if ((bVar7 & 1) == 0) {
          *pdVar35 = (double)(int)uVar27;
        }
        else {
          *(uint *)pdVar35 = uVar27;
          uVar11 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pdVar35 + 4) = uVar11;
        }
        pdVar35 = pdVar35 + 1;
      }
      pGVar17->firstline = uVar12;
      pGVar17->numline = uVar13;
      if ((int)__n == 0) {
        (pGVar17->lineinfo).ptr64 = 0;
        (pGVar17->uvinfo).ptr64 = 0;
        (pGVar17->varinfo).ptr64 = 0;
      }
      else {
        bVar7 = 2 - ((int)uVar13 < 0x10000);
        if ((int)uVar13 < 0x100) {
          bVar7 = 0;
        }
        pvVar19 = (void *)((long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar14);
        (pGVar17->lineinfo).ptr64 = (uint64_t)pvVar19;
        (pGVar17->uvinfo).ptr64 = (ulong)(uVar10 << (bVar7 & 0x1f)) + (long)pvVar19;
        pcVar28 = ls->p;
        ls->p = pcVar28 + __n;
        memcpy(pvVar19,pcVar28,__n);
        if (((ls->level & 1) != 0) && (0xff < pGVar17->numline)) {
          uVar21 = (ulong)(pGVar17->sizebc - 1);
          if ((uint)pGVar17->numline < 0x10000) {
            for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
              puVar2 = (ushort *)((long)pvVar19 + uVar25 * 2);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            }
          }
          else {
            for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
              uVar27 = *(uint *)((long)pvVar19 + uVar25 * 4);
              *(uint *)((long)pvVar19 + uVar25 * 4) =
                   uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                   uVar27 << 0x18;
            }
          }
        }
        pcVar23 = (char *)(pGVar17->uvinfo).ptr64;
        uVar27 = (uint)pGVar17->sizeuv;
        pcVar22 = pcVar23;
        pcVar28 = pcVar23;
        if (pGVar17->sizeuv != 0) {
          do {
            do {
              pcVar22 = pcVar23 + 1;
              cVar5 = *pcVar28;
              pcVar28 = pcVar28 + 1;
              pcVar23 = pcVar22;
            } while (cVar5 != '\0');
            uVar27 = uVar27 - 1;
            pcVar23 = pcVar28;
          } while (uVar27 != 0);
        }
        (pGVar17->varinfo).ptr64 = (uint64_t)pcVar22;
      }
      return pGVar17;
    }
    uVar15 = lj_buf_ruleb128(pp);
    if (uVar15 < 5) {
      if (uVar15 == 0) {
        plVar6 = ls->L;
        pTVar20 = plVar6->top;
        if (pTVar20 <= (TValue *)((long)ls->lastline + (plVar6->stack).ptr64)) {
          bcread_error(ls,LJ_ERR_BCBAD);
        }
        plVar6->top = pTVar20 + -1;
        pGVar18 = (GCstr *)(pTVar20[-1].u64 & 0x7fffffffffff);
        goto LAB_001214ac;
      }
      if (uVar15 == 1) {
        uVar15 = lj_buf_ruleb128(pp);
        uVar16 = lj_buf_ruleb128(pp);
        if (uVar16 == 0) {
          hbits = 0;
        }
        else {
          hbits = 1;
          if (uVar16 != 1) {
            uVar27 = 0x1f;
            if (uVar16 - 1 != 0) {
              for (; uVar16 - 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            hbits = (uVar27 ^ 0xffffffe0) + 0x21;
          }
        }
        t = lj_tab_new(ls->L,uVar15,hbits);
        if (uVar15 != 0) {
          pTVar20 = (TValue *)(t->array).ptr64;
          while (bVar36 = uVar15 != 0, uVar15 = uVar15 - 1, bVar36) {
            bcread_ktabk(ls,pTVar20);
            pTVar20 = pTVar20 + 1;
          }
        }
        if (uVar16 != 0) {
          while (bVar36 = uVar16 != 0, uVar16 = uVar16 - 1, bVar36) {
            bcread_ktabk(ls,&local_38);
            pTVar20 = lj_tab_set(ls->L,t,&local_38);
            bcread_ktabk(ls,pTVar20);
          }
        }
        *puVar34 = t;
      }
      else {
        sVar29 = (uVar15 != 2) + 0xb;
        if (uVar15 == 4) {
          sVar29 = 0x10;
        }
        pvVar19 = lj_mem_newgco(ls->L,(ulong)(uVar15 == 4) * 8 + 0x18);
        *(undefined1 *)((long)pvVar19 + 9) = 10;
        *(short *)((long)pvVar19 + 10) = sVar29;
        *puVar34 = pvVar19;
        uVar16 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pvVar19 + 0x10) = uVar16;
        uVar16 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pvVar19 + 0x14) = uVar16;
        if (uVar15 == 4) {
          uVar15 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar19 + 0x18) = uVar15;
          uVar15 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar19 + 0x1c) = uVar15;
        }
      }
    }
    else {
      pcVar28 = ls->p;
      ls->p = pcVar28 + (uVar15 - 5);
      pGVar18 = lj_str_new(ls->L,pcVar28,(ulong)(uVar15 - 5));
LAB_001214ac:
      *puVar34 = pGVar18;
    }
    uVar11 = uVar11 + 1;
    puVar34 = puVar34 + 1;
  } while( true );
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }
  return pt;
}